

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

void __thiscall btCollisionWorldImporter::~btCollisionWorldImporter(btCollisionWorldImporter *this)

{
  this->_vptr_btCollisionWorldImporter = (_func_int **)&PTR__btCollisionWorldImporter_001ecea8;
  btHashMap<btHashPtr,_btCollisionObject_*>::~btHashMap(&this->m_bodyMap);
  btHashMap<btHashPtr,_btCollisionShape_*>::~btHashMap(&this->m_shapeMap);
  btHashMap<btHashPtr,_const_char_*>::~btHashMap(&this->m_objectNameMap);
  btHashMap<btHashString,_btCollisionObject_*>::~btHashMap(&this->m_nameColObjMap);
  btHashMap<btHashString,_btCollisionShape_*>::~btHashMap(&this->m_nameShapeMap);
  btHashMap<btHashPtr,_btTriangleInfoMap_*>::~btHashMap(&this->m_timMap);
  btHashMap<btHashPtr,_btOptimizedBvh_*>::~btHashMap(&this->m_bvhMap);
  btAlignedObjectArray<btVector3DoubleData_*>::~btAlignedObjectArray(&this->m_doubleVertexArrays);
  btAlignedObjectArray<btVector3FloatData_*>::~btAlignedObjectArray(&this->m_floatVertexArrays);
  btAlignedObjectArray<unsigned_char_*>::~btAlignedObjectArray(&this->m_charIndexArrays);
  btAlignedObjectArray<short_*>::~btAlignedObjectArray(&this->m_shortIndexArrays);
  btAlignedObjectArray<int_*>::~btAlignedObjectArray(&this->m_indexArrays);
  btAlignedObjectArray<char_*>::~btAlignedObjectArray(&this->m_allocatedNames);
  btAlignedObjectArray<btCollisionObject_*>::~btAlignedObjectArray
            (&this->m_allocatedCollisionObjects);
  btAlignedObjectArray<btStridingMeshInterfaceData_*>::~btAlignedObjectArray
            (&this->m_allocatedbtStridingMeshInterfaceDatas);
  btAlignedObjectArray<btTriangleIndexVertexArray_*>::~btAlignedObjectArray
            (&this->m_allocatedTriangleIndexArrays);
  btAlignedObjectArray<btTriangleInfoMap_*>::~btAlignedObjectArray
            (&this->m_allocatedTriangleInfoMaps);
  btAlignedObjectArray<btOptimizedBvh_*>::~btAlignedObjectArray(&this->m_allocatedBvhs);
  btAlignedObjectArray<btCollisionObject_*>::~btAlignedObjectArray(&this->m_allocatedRigidBodies);
  btAlignedObjectArray<btCollisionShape_*>::~btAlignedObjectArray(&this->m_allocatedCollisionShapes)
  ;
  return;
}

Assistant:

btCollisionWorldImporter::~btCollisionWorldImporter()
{
}